

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O0

size_t ellipses::find_weakest_element
                 (vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *ellipses)

{
  allocator<double> *this;
  ulong uVar1;
  vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *pvVar2;
  bool bVar3;
  vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *pvVar4;
  const_reference pvVar5;
  size_type sVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  iterator iVar9;
  reference pvVar10;
  reference pdVar11;
  iterator iVar12;
  reference pvVar13;
  double dVar14;
  iterator iVar15;
  iterator __last;
  reference puVar16;
  size_t sVar17;
  Size2f *this_00;
  float fVar18;
  float extraout_XMM0_Da;
  double dVar19;
  value_type extraout_XMM0_Qa;
  undefined1 auVar20 [16];
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar21;
  float local_36c;
  bool local_2b9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_278;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  max_bad;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_260;
  double *local_258;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_250;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_248;
  double local_238;
  double aspect;
  size_t i_3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_220;
  double local_218;
  double mratios;
  double *local_200;
  RotatedRect *local_1f8;
  RotatedRect *local_1f0;
  allocator<double> local_1e1;
  undefined1 local_1e0 [8];
  vector<double,_std::allocator<double>_> ratios;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1b8;
  double *local_1b0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1a8;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_1a0;
  ulong local_190;
  size_t i_2;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_180;
  float local_174;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> _Stack_170;
  float mangles;
  float *local_160;
  RotatedRect *local_158;
  RotatedRect *local_150;
  allocator<float> local_141;
  undefined1 local_140 [8];
  vector<float,_std::allocator<float>_> angles;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_118;
  double *local_110;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_108;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_100;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_f0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> max;
  ulong local_e0;
  size_t i_1;
  Point mcenter;
  allocator<cv::Point_<float>_> local_a1;
  undefined1 local_a0 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> centers;
  undefined1 local_80 [8];
  vector<double,_std::allocator<double>_> distances;
  allocator<unsigned_long> local_51;
  value_type_conflict1 local_50;
  undefined1 local_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> bad_score;
  Point_<float> local_28;
  vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *local_20;
  size_t i;
  vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *ellipses_local;
  
  local_20 = (vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)0x0;
  i = (size_t)ellipses;
  while( true ) {
    pvVar2 = local_20;
    pvVar4 = (vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)
             std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::size
                       ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
    if (pvVar4 <= pvVar2) {
      sVar6 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::size
                        ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      local_50 = 0;
      std::allocator<unsigned_long>::allocator(&local_51);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,sVar6,&local_50,
                 &local_51);
      std::allocator<unsigned_long>::~allocator(&local_51);
      sVar6 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::size
                        ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      this = (allocator<double> *)
             ((long)&centers.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<double>::allocator(this);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_80,sVar6,this);
      std::allocator<double>::~allocator
                ((allocator<double> *)
                 ((long)&centers.
                         super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      sVar6 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::size
                        ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      std::allocator<cv::Point_<float>_>::allocator(&local_a1);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_a0,sVar6,
                 &local_a1);
      std::allocator<cv::Point_<float>_>::~allocator(&local_a1);
      cVar7 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::begin
                        ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      cVar8 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::end
                        ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      iVar9 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::begin
                        ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_a0)
      ;
      mcenter = (Point)std::
                       transform<__gnu_cxx::__normal_iterator<cv::RotatedRect_const*,std::vector<cv::RotatedRect,std::allocator<cv::RotatedRect>>>,__gnu_cxx::__normal_iterator<cv::Point_<float>*,std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>>,ellipses::find_weakest_element(std::vector<cv::RotatedRect,std::allocator<cv::RotatedRect>>const&)::__0>
                                 (cVar7._M_current,cVar8._M_current,iVar9._M_current);
      center_of_mass<std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>>
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&i_1);
      for (local_e0 = 0;
          sVar6 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::size
                            ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i),
          local_e0 < sVar6; local_e0 = local_e0 + 1) {
        cv::Point_<float>::Point_((Point_<float> *)&max,(float)(int)i_1,(float)i_1._4_4_);
        pvVar5 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::operator[]
                           ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i,local_e0)
        ;
        fVar18 = euclideanDistance<cv::Point_<float>>((Point_<float> *)&max,&pvVar5->center);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_80,local_e0);
        *pvVar10 = (double)fVar18;
      }
      local_108._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_80);
      local_118._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_80);
      local_110 = (double *)
                  __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator+(&local_118,3);
      local_100 = std::
                  minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                            (local_108,
                             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                              )local_110);
      local_f0 = local_100.second._M_current;
      pdVar11 = __gnu_cxx::
                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                operator*(&local_f0);
      if (20.0 < *pdVar11) {
        iVar12 = std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)local_80);
        angles.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)local_f0._M_current;
        sVar6 = std::
                distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                          ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )iVar12._M_current,local_f0);
        pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,sVar6
                            );
        *pvVar13 = *pvVar13 + 1;
      }
      sVar6 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::size
                        ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      std::allocator<float>::allocator(&local_141);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_140,sVar6,&local_141);
      std::allocator<float>::~allocator(&local_141);
      local_150 = (RotatedRect *)
                  std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::begin
                            ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      local_158 = (RotatedRect *)
                  std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::end
                            ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      local_160 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                     ((vector<float,_std::allocator<float>_> *)local_140);
      _Stack_170 = std::
                   transform<__gnu_cxx::__normal_iterator<cv::RotatedRect_const*,std::vector<cv::RotatedRect,std::allocator<cv::RotatedRect>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ellipses::find_weakest_element(std::vector<cv::RotatedRect,std::allocator<cv::RotatedRect>>const&)::__1>
                             (local_150,local_158,local_160);
      local_180._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)local_140);
      i_2 = (size_t)std::vector<float,_std::allocator<float>_>::end
                              ((vector<float,_std::allocator<float>_> *)local_140);
      fVar18 = std::
               accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,float>
                         (local_180,
                          (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                          i_2,0.0);
      sVar6 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)local_140);
      local_36c = (float)sVar6;
      local_174 = fVar18 / local_36c;
      local_190 = 0;
      while( true ) {
        uVar1 = local_190;
        sVar6 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::size
                          ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
        if (sVar6 <= uVar1) break;
        sVar17 = i;
        std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::operator[]
                  ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i,local_190);
        std::abs((int)sVar17);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_80,local_190);
        *pvVar10 = (double)extraout_XMM0_Da;
        local_190 = local_190 + 1;
      }
      local_1a8._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_80);
      local_1b8._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_80);
      local_1b0 = (double *)
                  __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator+(&local_1b8,3);
      local_1a0 = std::
                  minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                            (local_1a8,
                             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                              )local_1b0);
      local_f0 = local_1a0.second._M_current;
      iVar12 = std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)local_80);
      ratios.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_f0._M_current;
      sVar6 = std::
              distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         )iVar12._M_current,local_f0);
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,sVar6);
      *pvVar13 = *pvVar13 + 1;
      sVar6 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::size
                        ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      std::allocator<double>::allocator(&local_1e1);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_1e0,sVar6,&local_1e1);
      std::allocator<double>::~allocator(&local_1e1);
      local_1f0 = (RotatedRect *)
                  std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::begin
                            ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      local_1f8 = (RotatedRect *)
                  std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::end
                            ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
      local_200 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin
                            ((vector<double,_std::allocator<double>_> *)local_1e0);
      mratios = (double)std::
                        transform<__gnu_cxx::__normal_iterator<cv::RotatedRect_const*,std::vector<cv::RotatedRect,std::allocator<cv::RotatedRect>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,ellipses::find_weakest_element(std::vector<cv::RotatedRect,std::allocator<cv::RotatedRect>>const&)::__2>
                                  (local_1f0,local_1f8,local_200);
      local_220._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_1e0);
      i_3 = (size_t)std::vector<double,_std::allocator<double>_>::end
                              ((vector<double,_std::allocator<double>_> *)local_1e0);
      dVar19 = std::
               accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                         (local_220,
                          (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                           )i_3,0.0);
      sVar6 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_1e0);
      auVar20._8_4_ = (int)(sVar6 >> 0x20);
      auVar20._0_8_ = sVar6;
      auVar20._12_4_ = 0x45300000;
      local_218 = dVar19 / ((auVar20._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0));
      aspect = 0.0;
      while( true ) {
        dVar19 = aspect;
        dVar14 = (double)std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::size
                                   ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i);
        if ((ulong)dVar14 <= (ulong)dVar19) break;
        pvVar5 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::operator[]
                           ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i,
                            (size_type)aspect);
        this_00 = &pvVar5->size;
        local_238 = cv::Size_<float>::aspectRatio(this_00);
        std::abs((int)this_00);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_80,(size_type)aspect);
        *pvVar10 = extraout_XMM0_Qa;
        aspect = (double)((long)aspect + 1);
      }
      local_250._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_80);
      local_260._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_80);
      local_258 = (double *)
                  __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator+(&local_260,3);
      local_248 = std::
                  minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                            (local_250,
                             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                              )local_258);
      local_f0 = local_248.second._M_current;
      pdVar11 = __gnu_cxx::
                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                operator*(&local_f0);
      if (0.01 < *pdVar11) {
        iVar12 = std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)local_80);
        max_bad._M_current = (unsigned_long *)local_f0._M_current;
        sVar6 = std::
                distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                          ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )iVar12._M_current,local_f0);
        pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,sVar6
                            );
        *pvVar13 = *pvVar13 + 1;
      }
      iVar15 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
      __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
      pVar21 = std::
               minmax_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )iVar15._M_current,
                          (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )__last._M_current);
      local_278 = pVar21.second._M_current;
      puVar16 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_278);
      if (*puVar16 < 2) {
        ellipses_local =
             (vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
      }
      else {
        iVar15 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
        ellipses_local =
             (vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)
             std::
             distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )iVar15._M_current,local_278);
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_1e0);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_140);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_a0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_80);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
      return (size_t)ellipses_local;
    }
    pvVar5 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::operator[]
                       ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i,
                        (size_type)local_20);
    cv::Point_<float>::Point_(&local_28);
    bVar3 = cv::operator==(&pvVar5->center,&local_28);
    local_2b9 = false;
    if (bVar3) {
      pvVar5 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::operator[]
                         ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)i,
                          (size_type)local_20);
      cv::Size_<float>::Size_
                ((Size_<float> *)
                 &bad_score.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_2b9 = cv::operator==(&pvVar5->size,
                                 (Size_<float> *)
                                 &bad_score.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (local_2b9 != false) break;
    local_20 = (vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)
               ((long)&(local_20->
                       super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
  }
  return (size_t)local_20;
}

Assistant:

std::size_t find_weakest_element(const std::vector<cv::RotatedRect>& ellipses)
{
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        if(ellipses[i].center == cv::Point2f() && ellipses[i].size == cv::Size2f())
        {
            return i;
        }
    }

    std::vector<std::size_t> bad_score(ellipses.size(), 0);
    std::vector<double> distances(ellipses.size());

    std::vector<cv::Point2f> centers(ellipses.size());
    std::transform(
        ellipses.begin(), ellipses.end(), centers.begin(), [](const cv::RotatedRect& e) { return e.center; });
    auto mcenter = center_of_mass(centers);
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        distances[i] = euclideanDistance(
            cv::Point2f(static_cast<float>(mcenter.x), static_cast<float>(mcenter.y)), ellipses[i].center);
    }
    auto max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    if(*max > 20)
        bad_score[std::distance(distances.begin(), max)]++;

    std::vector<float> angles(ellipses.size());
    std::transform(ellipses.begin(), ellipses.end(), angles.begin(), [](const cv::RotatedRect& e) { return e.angle; });
    auto mangles = std::accumulate(angles.begin(), angles.end(), 0.f) / angles.size();
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        distances[i] = std::abs(mangles - ellipses[i].angle);
    }
    max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    bad_score[std::distance(distances.begin(), max)]++;

    std::vector<double> ratios(ellipses.size());
    std::transform(ellipses.begin(), ellipses.end(), ratios.begin(), [](const cv::RotatedRect& e) {
#if CV_MAJOR_VERSION < 3
        return e.size.width / static_cast<double>(e.size.height);
#else //! CV_MAJOR_VERSION > 3
            return e.size.aspectRatio();
#endif // CV_MAJOR_VERSION <> 3
    });
    auto mratios = std::accumulate(ratios.begin(), ratios.end(), 0.) / ratios.size();
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
#if CV_MAJOR_VERSION < 3
        double aspect = ellipses[i].size.width / static_cast<double>(ellipses[i].size.height);
#else //! CV_MAJOR_VERSION > 3
        double aspect = ellipses[i].size.aspectRatio();
#endif // CV_MAJOR_VERSION <> 3

        distances[i] = std::abs(mratios - aspect);
    }
    max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    if(*max > 0.01)
        bad_score[std::distance(distances.begin(), max)]++;

    auto max_bad = std::minmax_element(bad_score.begin(), bad_score.end()).second;
    if(*max_bad > 1)
        return std::distance(bad_score.begin(), max_bad);
    return bad_score.size();
}